

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O2

void __thiscall Controller::addViewPattern(Controller *this,string *name,View *view)

{
  ViewPattern temp;
  ViewPattern local_30;
  
  ViewPattern::ViewPattern(&local_30,name,view);
  std::vector<ViewPattern,_std::allocator<ViewPattern>_>::push_back(&views_list,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Controller::addViewPattern(const string &name, View *view) {
    ViewPattern temp = ViewPattern(name, view);
    views_list.push_back(temp);
}